

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QList<int> * __thiscall
QDockAreaLayoutInfo::findSeparator
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QPoint *_pos)

{
  int iVar1;
  Orientation OVar2;
  Representation RVar3;
  QSize QVar4;
  Representation RVar5;
  bool bVar6;
  char cVar7;
  QPoint *pQVar8;
  QSize QVar9;
  QSize QVar10;
  Representation RVar11;
  Representation index;
  ulong uVar12;
  QDockAreaLayoutItem *this_00;
  Representation RVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long in_FS_OFFSET;
  long local_88;
  long local_80;
  undefined1 local_68 [12];
  Representation RStack_5c;
  QList<int> local_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tabbed == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_003f1e82:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pQVar8 = (QPoint *)&_pos->yp;
    if (this->o == Horizontal) {
      pQVar8 = _pos;
    }
    if ((this->item_list).d.size != 0) {
      iVar1 = (pQVar8->xp).m_i;
      local_80 = 0x28;
      local_88 = 0;
      uVar12 = 0;
      do {
        this_00 = (this->item_list).d.ptr + uVar12;
        bVar6 = QDockAreaLayoutItem::skip(this_00);
        if ((!bVar6) && ((this_00->flags & 1) == 0)) {
          index.m_i = (int)uVar12;
          lVar14 = local_80;
          uVar15 = uVar12;
          lVar16 = local_88;
          if ((iVar1 < this_00->size + this_00->pos) &&
             (this_00->subinfo != (QDockAreaLayoutInfo *)0x0)) {
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
            findSeparator(&local_58,this_00->subinfo,_pos);
            if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
              (__return_storage_ptr__->d).d = (Data *)0x0;
              (__return_storage_ptr__->d).ptr = (int *)0x0;
              (__return_storage_ptr__->d).size = 0;
LAB_003f1e52:
              if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
                }
              }
            }
            else {
              local_68._0_4_ = index.m_i;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_58,0,(int *)local_68);
              (__return_storage_ptr__->d).d = local_58.d.d;
              (__return_storage_ptr__->d).ptr = local_58.d.ptr;
              (__return_storage_ptr__->d).size = local_58.d.size;
            }
            goto LAB_003f1d62;
          }
          do {
            uVar15 = uVar15 + 1;
            if ((ulong)(this->item_list).d.size <= uVar15) goto LAB_003f1d2d;
            lVar16 = lVar16 + 0x100000000;
            bVar6 = QDockAreaLayoutItem::skip
                              ((QDockAreaLayoutItem *)
                               ((long)&((this->item_list).d.ptr)->widgetItem + lVar14));
            lVar14 = lVar14 + 0x28;
          } while (bVar6);
          if (((this->item_list).d.ptr[lVar16 >> 0x20].flags & 1) == 0) {
            stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
            local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            _local_68 = separatorRect(this,index.m_i);
            RVar3 = local_68._0_4_;
            RVar11 = local_68._8_4_;
            RVar13 = local_68._12_4_;
            if ((local_68._4_4_.m_i + -1 != RVar13.m_i || RVar3.m_i + -1 != RVar11.m_i) &&
               (*this->sep == 1)) {
              local_68._4_4_ = local_68._4_4_.m_i + -2;
              local_68._0_4_ = RVar3.m_i + -2;
              local_68._8_4_ = RVar11.m_i + 2;
              RStack_5c.m_i = RVar13.m_i + 2;
            }
            cVar7 = QRect::contains((QPoint *)local_68,SUB81(_pos,0));
            if (cVar7 != '\0') {
              OVar2 = this->o;
              QVar9 = QDockAreaLayoutItem::minimumSize(this_00);
              QVar10 = QDockAreaLayoutItem::maximumSize(this_00);
              bVar6 = OVar2 == Vertical;
              QVar4 = (QSize)((ulong)QVar9 >> 0x20);
              if (bVar6) {
                QVar4 = QVar9;
              }
              RVar5 = QVar10.ht.m_i;
              if (bVar6) {
                RVar5 = QVar10.wd.m_i;
              }
              if (QVar4.wd.m_i.m_i != RVar5.m_i) {
                local_58.d.d = (Data *)0x0;
                local_58.d.ptr = (int *)0x0;
                local_58.d.size = 0;
                local_3c = index.m_i;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_58,0,&local_3c);
                QList<int>::end(&local_58);
                (__return_storage_ptr__->d).d = local_58.d.d;
                (__return_storage_ptr__->d).ptr = local_58.d.ptr;
                (__return_storage_ptr__->d).size = local_58.d.size;
                if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + 1;
                  UNLOCK();
                  goto LAB_003f1e52;
                }
                goto LAB_003f1d62;
              }
            }
          }
        }
LAB_003f1d2d:
        uVar12 = uVar12 + 1;
        local_88 = local_88 + 0x100000000;
        local_80 = local_80 + 0x28;
      } while (uVar12 < (ulong)(this->item_list).d.size);
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
LAB_003f1d62:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003f1e82;
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QDockAreaLayoutInfo::findSeparator(const QPoint &_pos) const
{
#if QT_CONFIG(tabbar)
    if (tabbed)
        return QList<int>();
#endif

    int pos = pick(o, _pos);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip() || (item.flags & QDockAreaLayoutItem::GapItem))
            continue;

        if (item.pos + item.size > pos) {
            if (item.subinfo != nullptr) {
                QList<int> result = item.subinfo->findSeparator(_pos);
                if (!result.isEmpty()) {
                    result.prepend(i);
                    return result;
                } else {
                    return QList<int>();
                }
            }
        }

        int next = this->next(i);
        if (next == -1 || (item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
            continue;

        QRect sepRect = separatorRect(i);
        if (!sepRect.isNull() && *sep == 1)
            sepRect.adjust(-2, -2, 2, 2);
        //we also make sure we don't find a separator that's not there
        if (sepRect.contains(_pos) && !item.hasFixedSize(o)) {
            return QList<int>() << i;
        }

    }

    return QList<int>();
}